

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O2

duckdb_decimal * __thiscall
duckdb::GetInternalCValue<duckdb_decimal,duckdb::TryCast>
          (duckdb_decimal *__return_storage_ptr__,duckdb *this,duckdb_result *result,idx_t col,
          idx_t row)

{
  bool bVar1;
  
  bVar1 = CanFetchValue((duckdb_result *)this,(idx_t)result,col);
  if (bVar1) {
    switch(*(undefined4 *)(*(long *)(this + 0x18) + 0x10 + (long)result * 0x28)) {
    case 1:
      TryCastCInternal<bool,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 2:
      TryCastCInternal<signed_char,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 3:
      TryCastCInternal<short,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 4:
      TryCastCInternal<int,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 5:
      TryCastCInternal<long,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 6:
      TryCastCInternal<unsigned_char,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 7:
      TryCastCInternal<unsigned_short,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 8:
      TryCastCInternal<unsigned_int,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 9:
      TryCastCInternal<unsigned_long,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 10:
      TryCastCInternal<float,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0xb:
      TryCastCInternal<double,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0xc:
      TryCastCInternal<duckdb::timestamp_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0xd:
      TryCastCInternal<duckdb::date_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0xe:
      TryCastCInternal<duckdb::dtime_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0xf:
      TryCastCInternal<duckdb::interval_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0x10:
      TryCastCInternal<duckdb::hugeint_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0x11:
      TryCastCInternal<char*,duckdb_decimal,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0x12:
      TryCastCInternal<duckdb_blob,duckdb_decimal,duckdb::FromCBlobCastWrapper>
                (__return_storage_ptr__,this,result,col,row);
      break;
    case 0x13:
      TryCastDecimalCInternal<duckdb_decimal>
                (__return_storage_ptr__,(duckdb_result *)this,(idx_t)result,col);
      break;
    default:
      goto switchD_00a15024_caseD_14;
    case 0x20:
      TryCastCInternal<duckdb::uhugeint_t,duckdb_decimal,duckdb::TryCast>
                (__return_storage_ptr__,this,result,col,row);
    }
  }
  else {
switchD_00a15024_caseD_14:
    FetchDefaultValue::Operation<duckdb_decimal>();
  }
  return __return_storage_ptr__;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}